

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.c
# Opt level: O0

_Bool upb_Message_DeepCopy
                (upb_Message *dst,upb_Message *src,upb_MiniTable *mini_table,upb_Arena *arena)

{
  _Bool _Var1;
  upb_Message *puVar2;
  upb_Arena *arena_local;
  upb_MiniTable *mini_table_local;
  upb_Message *src_local;
  upb_Message *dst_local;
  
  _Var1 = upb_Message_IsFrozen(dst);
  if (!_Var1) {
    upb_Message_Clear(dst,mini_table);
    puVar2 = _upb_Message_Copy(dst,src,mini_table,arena);
    return puVar2 != (upb_Message *)0x0;
  }
  __assert_fail("!upb_Message_IsFrozen(dst)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy.c"
                ,0x12e,
                "_Bool upb_Message_DeepCopy(upb_Message *, const upb_Message *, const upb_MiniTable *, upb_Arena *)"
               );
}

Assistant:

bool upb_Message_DeepCopy(upb_Message* dst, const upb_Message* src,
                          const upb_MiniTable* mini_table, upb_Arena* arena) {
  UPB_ASSERT(!upb_Message_IsFrozen(dst));
  upb_Message_Clear(dst, mini_table);
  return _upb_Message_Copy(dst, src, mini_table, arena) != NULL;
}